

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crab-cups.cpp
# Opt level: O1

cups_t * read_input_abi_cxx11_(cups_t *__return_storage_ptr__,string_view input)

{
  size_t *psVar1;
  int iVar2;
  int *piVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  undefined8 uVar6;
  size_t sVar7;
  char local_58;
  undefined1 uStack_57;
  size_t local_48;
  char *local_40;
  char *local_38;
  
  local_40 = input._M_str;
  local_48 = input._M_len;
  (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  _M_node._M_size = 0;
  (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  if (local_48 != 0) {
    sVar7 = 0;
    piVar3 = __errno_location();
    do {
      local_58 = local_40[sVar7];
      uStack_57 = 0;
      iVar2 = *piVar3;
      *piVar3 = 0;
      p_Var4 = (_List_node_base *)strtoull(&local_58,&local_38,10);
      if (local_38 == &local_58) {
        std::__throw_invalid_argument("stoull");
LAB_0010250a:
        uVar6 = std::__throw_out_of_range("stoull");
        p_Var4 = (__return_storage_ptr__->
                 super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl._M_node.
                 super__List_node_base._M_next;
        while (p_Var4 != (_List_node_base *)__return_storage_ptr__) {
          p_Var5 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var4->_M_next)
                   ->_M_impl)._M_node.super__List_node_base._M_next;
          operator_delete(p_Var4,0x18);
          p_Var4 = p_Var5;
        }
        _Unwind_Resume(uVar6);
      }
      if (*piVar3 == 0) {
        *piVar3 = iVar2;
      }
      else if (*piVar3 == 0x22) goto LAB_0010250a;
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = p_Var4;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(__return_storage_ptr__->
                super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
      sVar7 = sVar7 + 1;
    } while (local_48 != sVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

auto read_input(std::string_view input) {
  auto cups = cups_t {};
  ranges::transform(input, std::back_inserter(cups), [](char ch){
    return std::stoull(std::string{ch});
  });
  return cups;
}